

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

size_t __thiscall efsw::String::find(String *this,char *s,size_t pos)

{
  size_type sVar1;
  String local_38;
  
  String(&local_38,s);
  sVar1 = std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::find
                    (&this->mString,local_38.mString._M_dataplus._M_p,pos,
                     local_38.mString._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_38.mString._M_dataplus._M_p != &local_38.mString.field_2) {
    operator_delete(local_38.mString._M_dataplus._M_p);
  }
  return sVar1;
}

Assistant:

std::size_t String::find( const char* s, std::size_t pos ) const {
	return find( String( s ), pos );
}